

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_cabac.c
# Opt level: O0

IHEVCD_ERROR_T ihevcd_cabac_reset(cab_ctxt_t *ps_cabac,bitstrm_t *ps_bitstrm)

{
  uint uVar1;
  uint *puVar2;
  long in_RSI;
  undefined4 *in_RDI;
  UWORD32 pu4_word_tmp;
  uint local_18;
  
  if (in_RDI == (undefined4 *)0x0) {
    __assert_fail("(ps_cabac != ((void*)0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_cabac.c"
                  ,0xad,"IHEVCD_ERROR_T ihevcd_cabac_reset(cab_ctxt_t *, bitstrm_t *)");
  }
  if (in_RSI != 0) {
    *in_RDI = 0x7f800000;
    in_RDI[1] = (uint)(*(int *)(in_RSI + 0x18) << ((byte)*(undefined4 *)(in_RSI + 8) & 0x1f)) >> 1;
    *(int *)(in_RSI + 8) = *(int *)(in_RSI + 8) + 0x1f;
    if (0x20 < *(uint *)(in_RSI + 8)) {
      if (0x40U - *(int *)(in_RSI + 8) < 0x20) {
        local_18 = *(uint *)(in_RSI + 0x1c) >> (0x40U - (char)*(undefined4 *)(in_RSI + 8) & 0x1f);
      }
      else {
        local_18 = 0;
      }
      in_RDI[1] = local_18 | in_RDI[1];
    }
    if (0x1f < *(uint *)(in_RSI + 8)) {
      *(undefined4 *)(in_RSI + 0x18) = *(undefined4 *)(in_RSI + 0x1c);
      puVar2 = *(uint **)(in_RSI + 0x10);
      *(uint **)(in_RSI + 0x10) = puVar2 + 1;
      uVar1 = *puVar2;
      *(int *)(in_RSI + 8) = *(int *)(in_RSI + 8) + -0x20;
      *(uint *)(in_RSI + 0x1c) =
           uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
    }
    return 0;
  }
  __assert_fail("(ps_bitstrm != ((void*)0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_cabac.c"
                ,0xae,"IHEVCD_ERROR_T ihevcd_cabac_reset(cab_ctxt_t *, bitstrm_t *)");
}

Assistant:

IHEVCD_ERROR_T ihevcd_cabac_reset(cab_ctxt_t *ps_cabac,
                                  bitstrm_t *ps_bitstrm)
{
    /* Sanity checks */
    ASSERT(ps_cabac != NULL);
    ASSERT(ps_bitstrm != NULL);

    /* CABAC engine uses 32 bit range instead of 9 bits as specified by
     * the spec. This is done to reduce number of renormalizations
     */
    /* cabac engine initialization */
#if FULLRANGE
    ps_cabac->u4_range = (UWORD32)510 << RANGE_SHIFT;
    BITS_GET(ps_cabac->u4_ofst, ps_bitstrm->pu4_buf, ps_bitstrm->u4_bit_ofst,
                    ps_bitstrm->u4_cur_word, ps_bitstrm->u4_nxt_word, (9 + RANGE_SHIFT));

#else
    ps_cabac->u4_range = (UWORD32)510;
    BITS_GET(ps_cabac->u4_ofst, ps_bitstrm->pu4_buf, ps_bitstrm->u4_bit_ofst,
                    ps_bitstrm->u4_cur_word, ps_bitstrm->u4_nxt_word, 9);

#endif

    return ((IHEVCD_ERROR_T)IHEVCD_SUCCESS);
}